

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O0

void data_suite::segment_overfull(void)

{
  pointer *ppiVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> input;
  pointer ptVar2;
  pointer ptVar3;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  undefined1 auStack_618 [8];
  vector<int,_std::allocator<int>_> expect_19;
  undefined1 local_5f8 [8];
  segment segment_19;
  undefined1 auStack_5d8 [8];
  vector<int,_std::allocator<int>_> expect_18;
  segment segment_18;
  allocator<int> local_59d;
  int local_59c;
  iterator local_598;
  size_type local_590;
  undefined1 local_588 [8];
  vector<int,_std::allocator<int>_> expect_17;
  segment segment_17;
  allocator<int> local_54d;
  int local_54c [3];
  iterator local_540;
  size_type local_538;
  undefined1 local_530 [8];
  vector<int,_std::allocator<int>_> expect_16;
  segment segment_16;
  undefined1 auStack_4f8 [8];
  vector<int,_std::allocator<int>_> expect_15;
  undefined1 local_4d8 [8];
  segment segment_15;
  undefined1 auStack_4b8 [8];
  vector<int,_std::allocator<int>_> expect_14;
  undefined1 local_498 [8];
  segment segment_14;
  undefined1 auStack_478 [8];
  vector<int,_std::allocator<int>_> expect_13;
  undefined1 local_458 [8];
  segment segment_13;
  allocator<int> local_431;
  int local_430 [4];
  iterator local_420;
  size_type local_418;
  undefined1 local_410 [8];
  vector<int,_std::allocator<int>_> expect_12;
  segment segment_12;
  undefined1 auStack_3d8 [8];
  vector<int,_std::allocator<int>_> expect_11;
  undefined1 local_3b8 [8];
  segment segment_11;
  undefined1 auStack_398 [8];
  vector<int,_std::allocator<int>_> expect_10;
  segment segment_10;
  allocator<int> local_35d;
  int local_35c [3];
  iterator local_350;
  size_type local_348;
  undefined1 local_340 [8];
  vector<int,_std::allocator<int>_> expect_9;
  segment segment_9;
  allocator<int> local_305;
  int local_304;
  iterator local_300;
  size_type local_2f8;
  undefined1 local_2f0 [8];
  vector<int,_std::allocator<int>_> expect_8;
  segment segment_8;
  undefined1 auStack_2b8 [8];
  vector<int,_std::allocator<int>_> expect_7;
  undefined1 local_298 [8];
  segment segment_7;
  undefined1 auStack_278 [8];
  vector<int,_std::allocator<int>_> expect_6;
  undefined1 local_258 [8];
  segment segment_6;
  allocator<int> local_231;
  int local_230 [2];
  iterator local_228;
  size_type local_220;
  undefined1 local_218 [8];
  vector<int,_std::allocator<int>_> expect_5;
  segment segment_5;
  allocator<int> local_1d9;
  int local_1d8 [2];
  iterator local_1d0;
  size_type local_1c8;
  undefined1 local_1c0 [8];
  vector<int,_std::allocator<int>_> expect_4;
  segment segment_4;
  undefined1 auStack_188 [8];
  vector<int,_std::allocator<int>_> expect_3;
  undefined1 local_168 [8];
  segment segment_3;
  undefined1 auStack_148 [8];
  vector<int,_std::allocator<int>_> expect_2;
  segment segment_2;
  allocator<int> local_10d;
  int local_10c;
  iterator local_108;
  size_type local_100;
  undefined1 local_f8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  segment segment_1;
  allocator<int> local_ad;
  int local_ac [3];
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> expect;
  segment segment;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  segment.member.tail = (pointer)0x160000000b;
  input._M_len = 5;
  input._M_array = (iterator)&segment.member.tail;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_ac[0] = 0x16;
  local_ac[1] = 0x21;
  local_ac[2] = 0x2c;
  local_a0 = local_ac;
  local_98 = 3;
  std::allocator<int>::allocator(&local_ad);
  __l_07._M_len = local_98;
  __l_07._M_array = local_a0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_90,__l_07,&local_ad);
  std::allocator<int>::~allocator(&local_ad);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_90);
  iVar6 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_90)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x161,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_10c = 0x37;
  local_108 = &local_10c;
  local_100 = 1;
  std::allocator<int>::allocator(&local_10d);
  __l_06._M_len = local_100;
  __l_06._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f8,__l_06,&local_10d);
  std::allocator<int>::~allocator(&local_10d);
  ppiVar1 = &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_f8);
  iVar6 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_f8)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x168,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f8);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_unused_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_148 = (undefined1  [8])0x0;
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_148);
  ppiVar1 = &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_148);
  segment_3.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_148);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x16f,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_3.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_148);
  _local_168 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_188 = (undefined1  [8])0x0;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_188);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_168);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_168);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_168);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_188);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_188);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x176,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_188);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x42);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1d8[0] = 0x21;
  local_1d8[1] = 0x2c;
  local_1d0 = local_1d8;
  local_1c8 = 2;
  std::allocator<int>::allocator(&local_1d9);
  __l_05._M_len = local_1c8;
  __l_05._M_array = local_1d0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1c0,__l_05,&local_1d9);
  std::allocator<int>::~allocator(&local_1d9);
  ppiVar1 = &expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_1c0);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_1c0);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x17f,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1c0);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_230[0] = 0x37;
  local_230[1] = 0x42;
  local_228 = local_230;
  local_220 = 2;
  std::allocator<int>::allocator(&local_231);
  __l_04._M_len = local_220;
  __l_04._M_array = local_228;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_218,__l_04,&local_231);
  std::allocator<int>::~allocator(&local_231);
  ppiVar1 = &expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_218);
  segment_6.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_218);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x186,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_6.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_218);
  _local_258 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::first_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_278 = (undefined1  [8])0x0;
  expect_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_278);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_258);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_258);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_258);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_278);
  segment_7.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_278);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x18d,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_7.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_278);
  _local_298 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_2b8 = (undefined1  [8])0x0;
  expect_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_2b8);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_298);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_298);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_298);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_2b8);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_2b8);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x194,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_2b8);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x4d);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_304 = 0x2c;
  local_300 = &local_304;
  local_2f8 = 1;
  std::allocator<int>::allocator(&local_305);
  __l_03._M_len = local_2f8;
  __l_03._M_array = local_300;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_2f0,__l_03,&local_305);
  std::allocator<int>::~allocator(&local_305);
  ppiVar1 = &expect_8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_2f0);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_2f0);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x19d,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_2f0);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_35c[0] = 0x37;
  local_35c[1] = 0x42;
  local_35c[2] = 0x4d;
  local_350 = local_35c;
  local_348 = 3;
  std::allocator<int>::allocator(&local_35d);
  __l_02._M_len = local_348;
  __l_02._M_array = local_350;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_340,__l_02,&local_35d);
  std::allocator<int>::~allocator(&local_35d);
  ppiVar1 = &expect_9.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_340);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_340);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1a4,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_340);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_unused_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_398 = (undefined1  [8])0x0;
  expect_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_398);
  ppiVar1 = &expect_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_398);
  segment_11.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_398);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1ab,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_11.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_398);
  _local_3b8 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_3d8 = (undefined1  [8])0x0;
  expect_11.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_11.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_3d8);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_3b8);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_3b8);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_3b8);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_3d8);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_3d8);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1b2,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_3d8);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x58);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_430[0] = 0x37;
  local_430[1] = 0x42;
  local_430[2] = 0x4d;
  local_430[3] = 0x58;
  local_420 = local_430;
  local_418 = 4;
  std::allocator<int>::allocator(&local_431);
  __l_01._M_len = local_418;
  __l_01._M_array = local_420;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_410,__l_01,&local_431);
  std::allocator<int>::~allocator(&local_431);
  ppiVar1 = &expect_12.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_410);
  segment_13.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_410);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1bb,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_13.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_410);
  _local_458 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_478 = (undefined1  [8])0x0;
  expect_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_13.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_478);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_458);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_458);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_458);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_478);
  segment_14.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_478);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1c2,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_14.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_478);
  _local_498 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::first_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_4b8 = (undefined1  [8])0x0;
  expect_14.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_14.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_4b8);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_498);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_498);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_498);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_4b8);
  segment_15.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_4b8);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1c9,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_15.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_4b8);
  _local_4d8 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_4f8 = (undefined1  [8])0x0;
  expect_15.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_15.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_4f8);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_4d8);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_4d8);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_4d8);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_4f8);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_4f8);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1d0,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_4f8);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,99);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_54c[0] = 0x42;
  local_54c[1] = 0x4d;
  local_54c[2] = 0x58;
  local_540 = local_54c;
  local_538 = 3;
  std::allocator<int>::allocator(&local_54d);
  __l_00._M_len = local_538;
  __l_00._M_array = local_540;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_530,__l_00,&local_54d);
  std::allocator<int>::~allocator(&local_54d);
  ppiVar1 = &expect_16.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_530);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_530);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1d9,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_530);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_59c = 99;
  local_598 = &local_59c;
  local_590 = 1;
  std::allocator<int>::allocator(&local_59d);
  __l._M_len = local_590;
  __l._M_array = local_598;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_588,__l,&local_59d);
  std::allocator<int>::~allocator(&local_59d);
  ppiVar1 = &expect_17.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_588);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_588);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1e0,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_588);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::first_unused_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_5d8 = (undefined1  [8])0x0;
  expect_18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_5d8);
  ppiVar1 = &expect_18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)ppiVar1);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)ppiVar1);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_5d8);
  segment_19.member.tail =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)auStack_5d8);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1e7,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             segment_19.member.tail);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_5d8);
  _local_5f8 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_unused_segment
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_618 = (undefined1  [8])0x0;
  expect_19.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect_19.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_618);
  ptVar2 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_5f8);
  ptVar3 = vista::span<int,_18446744073709551615UL>::data
                     ((span<int,_18446744073709551615UL> *)local_5f8);
  sVar4 = vista::span<int,_18446744073709551615UL>::size
                    ((span<int,_18446744073709551615UL> *)local_5f8);
  iVar5 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)auStack_618);
  iVar6 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)auStack_618);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x1ee,"void data_suite::segment_overfull()",ptVar2,ptVar3 + sVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_618);
  return;
}

Assistant:

void segment_overfull()
{
    int array[4] = {};
    circular_view<int> span(array);
    // 55 22 33 44
    span = { 11, 22, 33, 44, 55 };
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { 22, 33, 44 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { 55 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    // 55 66 33 44
    span.push_back(66);
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { 55, 66 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    // 55 66 77 44
    span.push_back(77);
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { 55, 66, 77 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    // 55 66 77 88
    span.push_back(88);
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { 55, 66, 77, 88 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    // 99 66 77 88
    span.push_back(99);
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { 66, 77, 88 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { 99 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}